

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O2

void __thiscall
cppjieba::DictTrie::DictTrie
          (DictTrie *this,string *dict_path,string *user_dict_paths,
          UserWordWeightOption user_word_weight_opt)

{
  (this->static_node_infos_).
  super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->static_node_infos_).
  super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->static_node_infos_).
  super__Vector_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::_Deque_base
            (&(this->active_node_infos_).
              super__Deque_base<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>);
  (this->user_dict_single_chinese_word_)._M_h._M_buckets =
       &(this->user_dict_single_chinese_word_)._M_h._M_single_bucket;
  (this->user_dict_single_chinese_word_)._M_h._M_bucket_count = 1;
  (this->user_dict_single_chinese_word_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->user_dict_single_chinese_word_)._M_h._M_element_count = 0;
  (this->user_dict_single_chinese_word_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->user_dict_single_chinese_word_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->user_dict_single_chinese_word_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Init(this,dict_path,user_dict_paths,user_word_weight_opt);
  return;
}

Assistant:

DictTrie(const string& dict_path, const string& user_dict_paths = "", UserWordWeightOption user_word_weight_opt = WordWeightMedian) {
    Init(dict_path, user_dict_paths, user_word_weight_opt);
  }